

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_dictionary_createWithCapacity(sysbvm_context_t *context,size_t expectedCapacity)

{
  ulong slotCount;
  sysbvm_object_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_dictionary_t *result;
  size_t requiredStorageCapacity;
  size_t expectedCapacity_local;
  sysbvm_context_t *context_local;
  
  slotCount = (expectedCapacity * 0x82) / 100;
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).dictionaryType,2);
  sVar2 = sysbvm_tuple_size_encode(context,0);
  (psVar1->field_1).pointers[0] = sVar2;
  if (slotCount != 0) {
    sVar2 = sysbvm_array_create(context,slotCount);
    psVar1[1].header.field_0.typePointer = sVar2;
  }
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_dictionary_createWithCapacity(sysbvm_context_t *context, size_t expectedCapacity)
{
    size_t requiredStorageCapacity = expectedCapacity * 130 / 100;

    sysbvm_dictionary_t *result = (sysbvm_dictionary_t*)sysbvm_context_allocatePointerTuple(context, context->roots.dictionaryType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_dictionary_t));
    result->size = sysbvm_tuple_size_encode(context, 0);
    if(requiredStorageCapacity > 0)
        result->storage = sysbvm_array_create(context, requiredStorageCapacity);
    return (sysbvm_tuple_t)result;
}